

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTxyz.hpp
# Opt level: O2

void __thiscall OpenMD::NPTxyz::~NPTxyz(NPTxyz *this)

{
  NPT::~NPT((NPT *)this);
  operator_delete(this,0x328);
  return;
}

Assistant:

NPTxyz(SimInfo* info) : NPTf(info) {}